

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

Sphere * __thiscall rw::Atomic::getWorldBoundingSphere(Atomic *this)

{
  bool32 bVar1;
  Frame *pFVar2;
  Matrix *m;
  Matrix *ltm;
  Sphere *s;
  Atomic *this_local;
  
  pFVar2 = getFrame(this);
  bVar1 = Frame::dirty(pFVar2);
  if ((bVar1 != 0) || (((this->object).object.privateFlags & 1) != 0)) {
    pFVar2 = getFrame(this);
    m = Frame::getLTM(pFVar2);
    V3d::transformPoints(&(this->worldBoundingSphere).center,&(this->boundingSphere).center,1,m);
    (this->worldBoundingSphere).radius = (this->boundingSphere).radius;
    (this->object).object.privateFlags = (this->object).object.privateFlags & 0xfe;
  }
  return &this->worldBoundingSphere;
}

Assistant:

Sphere*
Atomic::getWorldBoundingSphere(void)
{
	Sphere *s = &this->worldBoundingSphere;
	// TODO: if we ever support morphing, check interpolation
	if(!this->getFrame()->dirty() &&
	   (this->object.object.privateFlags & WORLDBOUNDDIRTY) == 0)
		return s;
	Matrix *ltm = this->getFrame()->getLTM();
	// TODO: support scaling
	V3d::transformPoints(&s->center, &this->boundingSphere.center, 1, ltm);
	s->radius = this->boundingSphere.radius;
	this->object.object.privateFlags &= ~WORLDBOUNDDIRTY;
	return s;
}